

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3.cpp
# Opt level: O3

KBOOL __thiscall KDIS::DATA_TYPE::IFF_Layer3::operator==(IFF_Layer3 *this,IFF_Layer3 *Value)

{
  pointer pKVar1;
  pointer pKVar2;
  KBOOL KVar3;
  pointer pKVar4;
  StandardVariable **ppSVar5;
  bool bVar6;
  
  KVar3 = LayerHeader::operator!=(&this->super_LayerHeader,&Value->super_LayerHeader);
  if ((!KVar3) &&
     (KVar3 = SimulationIdentifier::operator!=(&this->m_RptSim,&Value->m_RptSim), !KVar3)) {
    pKVar1 = (this->m_vStdVarRecs).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pKVar2 = (this->m_vStdVarRecs).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pKVar4 = (Value->m_vStdVarRecs).
             super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pKVar2 - (long)pKVar1 ==
        (long)(Value->m_vStdVarRecs).
              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pKVar4) {
      if (pKVar1 == pKVar2) {
        return true;
      }
      ppSVar5 = &pKVar4->m_pRef;
      do {
        pKVar4 = pKVar1 + 1;
        bVar6 = pKVar1->m_pRef == *ppSVar5;
        if (!bVar6) {
          return bVar6;
        }
        ppSVar5 = ppSVar5 + 3;
        pKVar1 = pKVar4;
      } while (pKVar4 != pKVar2);
      return bVar6;
    }
  }
  return false;
}

Assistant:

KBOOL IFF_Layer3::operator == ( const IFF_Layer3 & Value ) const
{
    if( LayerHeader::operator !=( Value ) )            return false;    
    if( m_RptSim              != Value.m_RptSim )      return false;
    if( m_vStdVarRecs         != Value.m_vStdVarRecs ) return false;
    return true;
}